

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_cpuload.c
# Opt level: O0

void PaUtil_EndCpuLoadMeasurement(PaUtilCpuLoadMeasurer *measurer,unsigned_long framesProcessed)

{
  double dVar1;
  undefined1 auVar2 [16];
  double measuredLoad;
  double secondsFor100Percent;
  double measurementEndTime;
  unsigned_long framesProcessed_local;
  PaUtilCpuLoadMeasurer *measurer_local;
  
  if (framesProcessed != 0) {
    dVar1 = (double)PaUtil_GetTime();
    if (framesProcessed == 0) {
      __assert_fail("framesProcessed > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_cpuload.c"
                    ,0x56,
                    "void PaUtil_EndCpuLoadMeasurement(PaUtilCpuLoadMeasurer *, unsigned long)");
    }
    auVar2._8_4_ = (int)(framesProcessed >> 0x20);
    auVar2._0_8_ = framesProcessed;
    auVar2._12_4_ = 0x45300000;
    measurer->averageLoad =
         measurer->averageLoad * 0.9 +
         ((dVar1 - measurer->measurementStartTime) /
         (((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)framesProcessed) - 4503599627370496.0)) *
         measurer->samplingPeriod)) * 0.09999000000000002;
  }
  return;
}

Assistant:

void PaUtil_EndCpuLoadMeasurement( PaUtilCpuLoadMeasurer* measurer, unsigned long framesProcessed )
{
    double measurementEndTime, secondsFor100Percent, measuredLoad;

    if( framesProcessed > 0 ){
        measurementEndTime = PaUtil_GetTime();

        assert( framesProcessed > 0 );
        secondsFor100Percent = framesProcessed * measurer->samplingPeriod;

        measuredLoad = (measurementEndTime - measurer->measurementStartTime) / secondsFor100Percent;

        /* Low pass filter the calculated CPU load to reduce jitter using a simple IIR low pass filter. */
        /** FIXME @todo these coefficients shouldn't be hardwired see: http://www.portaudio.com/trac/ticket/113 */
#define LOWPASS_COEFFICIENT_0   (0.9)
#define LOWPASS_COEFFICIENT_1   (0.99999 - LOWPASS_COEFFICIENT_0)

        measurer->averageLoad = (LOWPASS_COEFFICIENT_0 * measurer->averageLoad) +
                               (LOWPASS_COEFFICIENT_1 * measuredLoad);
    }
}